

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_std::optional<unsigned_char>_&,_const_std::nullopt_t_&>::
streamReconstructedExpression
          (BinaryExpr<const_std::optional<unsigned_char>_&,_const_std::nullopt_t_&> *this,
          ostream *os)

{
  string *lhs;
  char *pcVar1;
  optional<unsigned_char> *in_RDX;
  nullopt_t *extraout_RDX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  StringMaker<std::optional<unsigned_char>,void>::convert_abi_cxx11_
            (&local_40,(StringMaker<std::optional<unsigned_char>,void> *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<std::nullopt_t,void>::convert_abi_cxx11_
            (&local_60,(StringMaker<std::nullopt_t,void> *)this->m_rhs,extraout_RDX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }